

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EmptyTimingCheckArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyTimingCheckArgSyntax,slang::syntax::EmptyTimingCheckArgSyntax_const&>
          (BumpAllocator *this,EmptyTimingCheckArgSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  EmptyTimingCheckArgSyntax *pEVar8;
  
  pEVar8 = (EmptyTimingCheckArgSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyTimingCheckArgSyntax *)this->endPtr < pEVar8 + 1) {
    pEVar8 = (EmptyTimingCheckArgSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pEVar8 + 1);
  }
  (pEVar8->placeholder).info = (args->placeholder).info;
  SVar6 = (args->super_TimingCheckArgSyntax).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_TimingCheckArgSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingCheckArgSyntax).super_SyntaxNode.parent;
  TVar2 = (args->placeholder).kind;
  uVar3 = (args->placeholder).field_0x2;
  NVar4.raw = (args->placeholder).numFlags.raw;
  uVar5 = (args->placeholder).rawLen;
  (pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.previewNode =
       (args->super_TimingCheckArgSyntax).super_SyntaxNode.previewNode;
  (pEVar8->placeholder).kind = TVar2;
  (pEVar8->placeholder).field_0x2 = uVar3;
  (pEVar8->placeholder).numFlags = (NumericTokenFlags)NVar4.raw;
  (pEVar8->placeholder).rawLen = uVar5;
  (pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.kind = SVar6;
  *(undefined4 *)&(pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.field_0x4 = uVar7;
  (pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.parent = pSVar1;
  return pEVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }